

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

bool __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push_or_set_key
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  
  bVar4 = contains(this,id);
  if (bVar4) {
    piVar2 = (this->heap).
             super__Vector_base<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->id_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[id];
    if (piVar2[iVar1].key < key) {
      piVar2[iVar1].key = key;
      move_down(this,piVar3[id]);
    }
    else {
      if (piVar2[iVar1].key <= key) {
        return false;
      }
      piVar2[iVar1].key = key;
      move_up(this,piVar3[id]);
    }
  }
  else {
    push(this,id,key);
  }
  return true;
}

Assistant:

bool push_or_set_key(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");

        check_id_invariants();
        check_order_invariants();

        if (!contains(id)) {
            push(id, key);
            return true;
        } else {
            if (order(heap[id_pos[id]].key, key)) {
                heap[id_pos[id]].key = std::move(key);
                move_down(id_pos[id]);

                check_id_invariants();
                check_order_invariants();

                return true;
            } else if (order(key, heap[id_pos[id]].key)) {
                heap[id_pos[id]].key = std::move(key);
                move_up(id_pos[id]);

                check_id_invariants();
                check_order_invariants();

                return true;
            }
        }
        return false;
    }